

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O3

int64_t wallet::GetImportTimestamp(UniValue *data,int64_t now)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  UniValue *pUVar4;
  string *this;
  UniValue *__return_storage_ptr__;
  char **in_RCX;
  long in_FS_OFFSET;
  size_t i;
  char *local_58;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"timestamp","");
  bVar2 = UniValue::findKey(data,&local_50,(size_t *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (!bVar2) {
    pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Missing required timestamp field for key","");
    JSONRPCError(pUVar4,-3,&local_50);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
    }
    goto LAB_002881cf;
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"timestamp","");
  pUVar4 = UniValue::operator[](data,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (pUVar4->typ == VSTR) {
    this = UniValue::get_str_abi_cxx11_(pUVar4);
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (this,"now");
    if (iVar3 != 0) goto LAB_002880d5;
  }
  else {
    if (pUVar4->typ != VNUM) {
LAB_002880d5:
      __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
      local_58 = uvTypeName(pUVar4->typ);
      tinyformat::format<char_const*>
                (&local_50,
                 (tinyformat *)"Expected number or \"now\" timestamp value for key. got type %s",
                 (char *)&local_58,in_RCX);
      JSONRPCError(__return_storage_ptr__,-3,&local_50);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_002881cf;
    }
    now = UniValue::getInt<long>(pUVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return now;
  }
LAB_002881cf:
  __stack_chk_fail();
}

Assistant:

static int64_t GetImportTimestamp(const UniValue& data, int64_t now)
{
    if (data.exists("timestamp")) {
        const UniValue& timestamp = data["timestamp"];
        if (timestamp.isNum()) {
            return timestamp.getInt<int64_t>();
        } else if (timestamp.isStr() && timestamp.get_str() == "now") {
            return now;
        }
        throw JSONRPCError(RPC_TYPE_ERROR, strprintf("Expected number or \"now\" timestamp value for key. got type %s", uvTypeName(timestamp.type())));
    }
    throw JSONRPCError(RPC_TYPE_ERROR, "Missing required timestamp field for key");
}